

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

int Mf_ManTruthCanonicize(word *t,int nVars)

{
  word wVar1;
  undefined4 local_34;
  undefined4 local_30;
  int Config;
  int i;
  int r;
  word Best;
  word Temp;
  int nVars_local;
  word *t_local;
  
  _i = *t;
  local_34 = 0;
  for (Config = 0; Config < 1; Config = Config + 1) {
    if ((_i ^ 0xffffffffffffffff) < _i) {
      local_34 = 1 << ((byte)nVars & 0x1f) ^ local_34;
      _i = _i ^ 0xffffffffffffffff;
    }
    for (local_30 = 0; local_30 < nVars; local_30 = local_30 + 1) {
      wVar1 = Abc_Tt6Flip(_i,local_30);
      if (wVar1 < _i) {
        local_34 = 1 << ((byte)local_30 & 0x1f) ^ local_34;
        _i = wVar1;
      }
    }
  }
  *t = _i;
  if (s_vTtMem == (Vec_Mem_t *)0x0) {
    s_vTtMem = Vec_MemAllocForTT(6,0);
  }
  Vec_MemHashInsert(s_vTtMem,t);
  s_nCalls = s_nCalls + 1;
  return local_34;
}

Assistant:

int Mf_ManTruthCanonicize( word * t, int nVars )
{
    word Temp, Best = *t;
    int r, i, Config = 0;
    for ( r = 0; r < 1; r++ )
    {
        if ( Best > (Temp = ~Best) )
            Best = Temp, Config ^= (1 << nVars);
        for ( i = 0; i < nVars; i++ )
            if ( Best > (Temp = Abc_Tt6Flip(Best, i)) )
                Best = Temp, Config ^= (1 << i);
    }
    *t = Best;
    if ( s_vTtMem == NULL )
        s_vTtMem = Vec_MemAllocForTT( 6, 0 );
    Vec_MemHashInsert( s_vTtMem, t );
    s_nCalls++;
    return Config;
}